

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateEnumToPool(EnumDescriptor *en,Printer *printer)

{
  long lVar1;
  Printer *pPVar2;
  long *plVar3;
  bool in_CL;
  size_type *psVar4;
  long lVar5;
  long lVar6;
  string local_98;
  Printer *local_78;
  string local_70;
  string local_50;
  
  EnumFullName_abi_cxx11_(&local_98,(php *)en,(EnumDescriptor *)0x1,in_CL);
  local_78 = printer;
  io::Printer::Print(printer,
                     "$pool->addEnum(\'^name^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n"
                     ,"name",&local_98,"class_name",*(string **)en);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = local_78;
  io::Printer::Indent(local_78);
  io::Printer::Indent(pPVar2);
  if (0 < *(int *)(en + 0x2c)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      lVar1 = *(long *)(en + 0x30);
      ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_50,*(string **)(lVar1 + lVar5),en);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,**(ulong **)(lVar1 + lVar5));
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_98.field_2._M_allocated_capacity = *psVar4;
        local_98.field_2._8_8_ = plVar3[3];
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar4;
        local_98._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_98._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      IntToString_abi_cxx11_
                (&local_70,(php *)(ulong)*(uint *)(lVar1 + 0x10 + lVar5),
                 (int32)local_98._M_string_length);
      io::Printer::Print(local_78,"->value(\"^name^\", ^number^)\n","name",&local_98,"number",
                         &local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar6 < *(int *)(en + 0x2c));
  }
  pPVar2 = local_78;
  io::Printer::Print(local_78,"->finalizeToPool();\n\n");
  io::Printer::Outdent(pPVar2);
  io::Printer::Outdent(pPVar2);
  return;
}

Assistant:

void GenerateEnumToPool(const EnumDescriptor* en, io::Printer* printer) {
  printer->Print(
      "$pool->addEnum('^name^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "name", EnumFullName(en, true),
      "class_name", en->name());
  Indent(printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer->Print(
        "->value(\"^name^\", ^number^)\n",
        "name", ClassNamePrefix(value->name(), en) + value->name(),
        "number", IntToString(value->number()));
  }
  printer->Print("->finalizeToPool();\n\n");
  Outdent(printer);
}